

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printWhile(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"while");
  space(this);
  emit(this,'(');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar1);
  emit(this,')');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar1,"{}");
  return;
}

Assistant:

void printWhile(Ref node) {
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    print(node[2], "{}");
  }